

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void reportDefault(XML_Parser parser,ENCODING *enc,char *s,char *end)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ICHAR *dataPtr;
  char *local_40;
  char *local_38;
  
  local_40 = s;
  if (enc->isUtf8 != '\0') {
    (**(code **)((long)parser + 0xa0))(*(undefined8 *)((long)parser + 8),s,(int)end - (int)s);
    return;
  }
  if (*(ENCODING **)((long)parser + 0x118) == enc) {
    puVar1 = (undefined8 *)((long)parser + 0x218);
    puVar2 = (undefined8 *)((long)parser + 0x220);
  }
  else {
    puVar1 = *(undefined8 **)((long)parser + 0x230);
    puVar2 = puVar1 + 1;
  }
  do {
    local_38 = *(char **)((long)parser + 0x58);
    (*enc->utf8Convert)(enc,&local_40,end,&local_38,*(char **)((long)parser + 0x60));
    *puVar2 = local_40;
    (**(code **)((long)parser + 0xa0))
              (*(undefined8 *)((long)parser + 8),*(undefined8 *)((long)parser + 0x58),
               (int)local_38 - (int)*(undefined8 *)((long)parser + 0x58));
    *puVar1 = local_40;
  } while (local_40 != end);
  return;
}

Assistant:

static void
reportDefault(XML_Parser parser, const ENCODING *enc, const char *s, const char *end)
{
  if (MUST_CONVERT(enc, s)) {
    const char **eventPP;
    const char **eventEndPP;
    if (enc == encoding) {
      eventPP = &eventPtr;
      eventEndPP = &eventEndPtr;
    }
    else {
      eventPP = &(openInternalEntities->internalEventPtr);
      eventEndPP = &(openInternalEntities->internalEventEndPtr);
    }
    do {
      ICHAR *dataPtr = (ICHAR *)dataBuf;
      XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
      *eventEndPP = s;
      defaultHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
      *eventPP = s;
    } while (s != end);
  }
  else
    defaultHandler(handlerArg, (XML_Char *)s, (XML_Char *)end - (XML_Char *)s);
}